

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

void __thiscall
slang::analysis::DataFlowAnalysis::noteReference
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  undefined1 *puVar1;
  char *pcVar2;
  Path *this_00;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  Type *rootType;
  value_type *elements;
  ulong uVar9;
  allocator_type *alloc;
  EVP_PKEY_CTX *pEVar10;
  overlap_iterator *ctx;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  SymbolLSPMap *this_01;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  pair<unsigned_long,_unsigned_long> pVar23;
  try_emplace_args_t local_17d;
  uint local_17c;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  overlap_iterator lspIt;
  overlap_iterator local_d0;
  overlap_iterator local_80;
  
  if ((this->
      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>)
      .state.reachable == true) {
    rootType = ast::DeclaredType::getType(&symbol->declaredType);
    ast::ValueDriver::getBounds
              (&bounds,lsp,
               &(this->
                super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                ).super_FlowAnalysisBase.evalContext,rootType);
    if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>._M_payload.
        super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged == true) {
      local_d0.super_iterator.super_const_iterator.map =
           (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)symbol;
      if (this->isLValue == true) {
        puVar1 = &(this->symbolToSlot).super_Storage.field_0x48;
        local_17c = (uint)(this->lvalues).
                          super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.len
        ;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = symbol;
        uVar12 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar9 = uVar12 >> ((this->symbolToSlot).field_0x50 & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar12 & 0xff];
        uVar16 = *(ulong *)&(this->symbolToSlot).field_0x58;
        uVar11 = 0;
        uVar15 = uVar9;
        do {
          pcVar2 = (char *)(*(long *)&(this->symbolToSlot).field_0x60 + uVar15 * 0x10);
          cVar17 = (char)uVar3;
          auVar21[0] = -(*pcVar2 == cVar17);
          cVar18 = (char)((uint)uVar3 >> 8);
          auVar21[1] = -(pcVar2[1] == cVar18);
          cVar19 = (char)((uint)uVar3 >> 0x10);
          auVar21[2] = -(pcVar2[2] == cVar19);
          bVar20 = (byte)((uint)uVar3 >> 0x18);
          auVar21[3] = -(pcVar2[3] == bVar20);
          auVar21[4] = -(pcVar2[4] == cVar17);
          auVar21[5] = -(pcVar2[5] == cVar18);
          auVar21[6] = -(pcVar2[6] == cVar19);
          auVar21[7] = -(pcVar2[7] == bVar20);
          auVar21[8] = -(pcVar2[8] == cVar17);
          auVar21[9] = -(pcVar2[9] == cVar18);
          auVar21[10] = -(pcVar2[10] == cVar19);
          auVar21[0xb] = -(pcVar2[0xb] == bVar20);
          auVar21[0xc] = -(pcVar2[0xc] == cVar17);
          auVar21[0xd] = -(pcVar2[0xd] == cVar18);
          auVar21[0xe] = -(pcVar2[0xe] == cVar19);
          auVar21[0xf] = -(pcVar2[0xf] == bVar20);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
          if (uVar13 != 0) {
            lVar14 = *(long *)&(this->symbolToSlot).field_0x68 + uVar15 * 0xf0;
            do {
              iVar4 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              if (*(ValueSymbol **)(lVar14 + (ulong)(uint)(iVar4 << 4)) == symbol) {
                lspIt.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len =
                     lVar14 + (ulong)(uint)(iVar4 << 4);
                goto LAB_0029ad05;
              }
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & pcVar2[0xf]) == 0)
          break;
          lVar14 = uVar15 + uVar11;
          uVar11 = uVar11 + 1;
          uVar15 = lVar14 + 1U & uVar16;
        } while (uVar11 <= uVar16);
        if (*(ulong *)&(this->symbolToSlot).field_0x78 < *(ulong *)&(this->symbolToSlot).field_0x70)
        {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                    ((locator *)&lspIt,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                      *)puVar1,uVar9,uVar12,&local_17d,(ValueSymbol **)&local_d0,&local_17c);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                    ((locator *)&lspIt,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                      *)puVar1,uVar12,&local_17d,(ValueSymbol **)&local_d0,&local_17c);
        }
        SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::
        emplace_back<slang::ast::ValueSymbol_const&>
                  (&(this->lvalues).
                    super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>,symbol);
LAB_0029ad05:
        uVar16 = (ulong)*(uint *)(lspIt.super_iterator.super_const_iterator.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len
                                 + 8);
        if ((this->
            super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
            ).state.assigned.
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len <=
            uVar16) {
          SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::resize
                    ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                     &(this->
                      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                      ).state,(ulong)(*(uint *)(lspIt.super_iterator.super_const_iterator.path.path.
                                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                                .len + 8) + 1));
        }
        IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                  ((this->
                   super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                   ).state.assigned.
                   super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                   data_ + uVar16,(pair<unsigned_long,_unsigned_long> *)&bounds,(monostate *)&lspIt,
                   &this->bitMapAllocator);
        this_01 = &(this->lvalues).
                   super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_
                   [uVar16].assigned;
        IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                  (&lspIt,this_01,(pair<unsigned_long,_unsigned_long> *)&bounds);
        this_00 = &local_d0.super_iterator.super_const_iterator.path;
        alloc = &this->lspMapAllocator;
        do {
          while( true ) {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                      (&local_d0.super_iterator,this_01);
            pEVar10 = (EVP_PKEY_CTX *)this_00;
            bVar8 = IntervalMapDetails::Path::operator==
                              (&lspIt.super_iterator.super_const_iterator.path,this_00);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00,pEVar10);
            if (bVar8) {
              SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                        ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                         &lspIt.super_iterator.super_const_iterator.path,pEVar10);
              lspIt.super_iterator.super_const_iterator.map =
                   (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)lsp;
              IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::insert
                        (this_01,(pair<unsigned_long,_unsigned_long> *)&bounds,(Expression **)&lspIt
                         ,alloc);
              return;
            }
            pVar23 = IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator
                     ::bounds((const_iterator *)&lspIt);
            if (pVar23.first <=
                bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                _M_payload._M_value.first) break;
            if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                _M_payload._M_value.second <= pVar23.second) goto LAB_0029ae2e;
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            overlap_iterator(&local_80,&lspIt);
            pEVar10 = (EVP_PKEY_CTX *)alloc;
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::iterator::erase
                      (&local_80.super_iterator,alloc,true);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                       &local_80.super_iterator.super_const_iterator.path,pEVar10);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                      (&local_d0,this_01,(pair<unsigned_long,_unsigned_long> *)&bounds);
            ctx = &local_d0;
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            operator=(&lspIt,&local_d0);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                       &local_d0.super_iterator.super_const_iterator.path,(EVP_PKEY_CTX *)ctx);
          }
          if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
              _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
              _M_payload._M_value.second <= pVar23.second) {
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                       &lspIt.super_iterator.super_const_iterator.path,pEVar10);
            return;
          }
LAB_0029ae2e:
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
          operator++(&lspIt);
        } while( true );
      }
      puVar1 = &(this->rvalues).super_Storage.field_0x128;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = symbol;
      uVar11 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar9 = uVar11 >> ((this->rvalues).field_0x130 & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar11 & 0xff];
      uVar16 = *(ulong *)&(this->rvalues).field_0x138;
      uVar12 = 0;
      uVar15 = uVar9;
      do {
        pcVar2 = (char *)(*(long *)&(this->rvalues).field_0x140 + uVar15 * 0x10);
        cVar17 = (char)uVar3;
        auVar22[0] = -(*pcVar2 == cVar17);
        cVar18 = (char)((uint)uVar3 >> 8);
        auVar22[1] = -(pcVar2[1] == cVar18);
        cVar19 = (char)((uint)uVar3 >> 0x10);
        auVar22[2] = -(pcVar2[2] == cVar19);
        bVar20 = (byte)((uint)uVar3 >> 0x18);
        auVar22[3] = -(pcVar2[3] == bVar20);
        auVar22[4] = -(pcVar2[4] == cVar17);
        auVar22[5] = -(pcVar2[5] == cVar18);
        auVar22[6] = -(pcVar2[6] == cVar19);
        auVar22[7] = -(pcVar2[7] == bVar20);
        auVar22[8] = -(pcVar2[8] == cVar17);
        auVar22[9] = -(pcVar2[9] == cVar18);
        auVar22[10] = -(pcVar2[10] == cVar19);
        auVar22[0xb] = -(pcVar2[0xb] == bVar20);
        auVar22[0xc] = -(pcVar2[0xc] == cVar17);
        auVar22[0xd] = -(pcVar2[0xd] == cVar18);
        auVar22[0xe] = -(pcVar2[0xe] == cVar19);
        auVar22[0xf] = -(pcVar2[0xf] == bVar20);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          lVar14 = *(long *)&(this->rvalues).field_0x148 + uVar15 * 0x438;
          do {
            uVar5 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if (*(ValueSymbol **)(lVar14 + (ulong)uVar5 * 0x48) == symbol) {
              lspIt.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len =
                   lVar14 + (ulong)uVar5 * 0x48;
              goto LAB_0029ae67;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & pcVar2[0xf]) == 0)
        break;
        lVar14 = uVar15 + uVar12;
        uVar12 = uVar12 + 1;
        uVar15 = lVar14 + 1U & uVar16;
      } while (uVar12 <= uVar16);
      if (*(ulong *)&(this->rvalues).field_0x158 < *(ulong *)&(this->rvalues).field_0x150) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                  ((locator *)&lspIt,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                    *)puVar1,uVar9,uVar11,(try_emplace_args_t *)&local_17c,(ValueSymbol **)&local_d0
                  );
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                  ((locator *)&lspIt,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                    *)puVar1,uVar11,(try_emplace_args_t *)&local_17c,(ValueSymbol **)&local_d0);
      }
LAB_0029ae67:
      IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                ((IntervalMap<unsigned_long,_std::monostate,_3U> *)
                 (lspIt.super_iterator.super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len + 8),
                 (pair<unsigned_long,_unsigned_long> *)&bounds,(monostate *)&lspIt,
                 &this->bitMapAllocator);
    }
  }
  return;
}

Assistant:

void DataFlowAnalysis::noteReference(const ValueSymbol& symbol, const Expression& lsp) {
    // This feels icky but we don't count a symbol as being referenced in the procedure
    // if it's only used inside an unreachable flow path. The alternative would just
    // frustrate users, but the reason it's icky is because whether a path is reachable
    // is based on whatever level of heuristics we're willing to implement rather than
    // some well defined set of rules in the LRM.
    auto& currState = getState();
    if (!currState.reachable)
        return;

    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds) {
        // This probably cannot be hit given that we early out elsewhere for
        // invalid expressions.
        return;
    }

    if (isLValue) {
        auto [it, inserted] = symbolToSlot.try_emplace(&symbol, (uint32_t)lvalues.size());
        if (inserted) {
            lvalues.emplace_back(symbol);
            SLANG_ASSERT(lvalues.size() == symbolToSlot.size());
        }

        auto index = it->second;
        if (index >= currState.assigned.size())
            currState.assigned.resize(index + 1);

        currState.assigned[index].unionWith(*bounds, {}, bitMapAllocator);

        auto& lspMap = lvalues[index].assigned;
        for (auto lspIt = lspMap.find(*bounds); lspIt != lspMap.end();) {
            // If we find an existing entry that completely contains
            // the new bounds we can just keep that one and ignore the
            // new one. Otherwise we will insert a new entry.
            auto itBounds = lspIt.bounds();
            if (itBounds.first <= bounds->first && itBounds.second >= bounds->second)
                return;

            // If the new bounds completely contain the existing entry, we can remove it.
            if (bounds->first < itBounds.first && bounds->second > itBounds.second) {
                lspMap.erase(lspIt, lspMapAllocator);
                lspIt = lspMap.find(*bounds);
            }
            else {
                ++lspIt;
            }
        }
        lspMap.insert(*bounds, &lsp, lspMapAllocator);
    }
    else {
        rvalues[&symbol].unionWith(*bounds, {}, bitMapAllocator);
    }
}